

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Contacts.cc
# Opt level: O0

bool __thiscall RigidBodyDynamics::ConstraintSet::Bind(ConstraintSet *this,Model *model)

{
  ostream *this_00;
  size_t sVar1;
  allocator_type *__a;
  long in_RSI;
  long in_RDI;
  vector<SpatialMatrix_t,_std::allocator<SpatialMatrix_t>_> *this_01;
  EigenBase<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_> *matrix;
  HouseholderQR<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *this_02;
  uint n_constr;
  HouseholderQR<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *in_stack_fffffffffffffcf8;
  DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
  *other;
  HouseholderQR<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *in_stack_fffffffffffffd00;
  Vector3_t *this_03;
  Index in_stack_fffffffffffffd08;
  value_type *__value;
  undefined1 *__n;
  value_type *in_stack_fffffffffffffd20;
  vector<Vector3_t,_std::allocator<Vector3_t>_> *this_04;
  size_type in_stack_fffffffffffffd28;
  value_type *in_stack_fffffffffffffd30;
  value_type *val;
  size_type in_stack_fffffffffffffd38;
  double *num;
  undefined1 local_1e1;
  undefined1 local_1e0 [64];
  DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
  local_1a0 [24];
  vector<Vector3_t,_std::allocator<Vector3_t>_> local_188;
  value_type local_170;
  undefined4 local_14;
  long local_10;
  
  if ((*(byte *)(in_RDI + 4) & 1) != 0) {
    this_00 = std::operator<<((ostream *)&std::cerr,
                              "Error: binding an already bound constraint set!");
    std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
    abort();
  }
  local_10 = in_RSI;
  sVar1 = size((ConstraintSet *)0x14b921);
  local_14 = (undefined4)sVar1;
  this_01 = (vector<SpatialMatrix_t,_std::allocator<SpatialMatrix_t>_> *)(in_RDI + 0xa8);
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::conservativeResize
            ((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)in_stack_fffffffffffffd00
             ,(Index)in_stack_fffffffffffffcf8,0x14b951);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::setZero
            ((DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)in_stack_fffffffffffffd00);
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::conservativeResize
            ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)in_stack_fffffffffffffd00,
             (Index)in_stack_fffffffffffffcf8);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::setZero
            ((DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)in_stack_fffffffffffffd00);
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::conservativeResize
            ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)in_stack_fffffffffffffd00,
             (Index)in_stack_fffffffffffffcf8);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::setZero
            ((DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)in_stack_fffffffffffffd00);
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::conservativeResize
            ((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)in_stack_fffffffffffffd00
             ,(Index)in_stack_fffffffffffffcf8,0x14b9e9);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::setZero
            ((DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)in_stack_fffffffffffffd00);
  matrix = (EigenBase<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_> *)
           (in_RDI + 0xf8);
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::conservativeResize
            ((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)in_stack_fffffffffffffd00
             ,(Index)in_stack_fffffffffffffcf8,0x14ba28);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::setZero
            ((DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)in_stack_fffffffffffffd00);
  this_02 = (HouseholderQR<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)(in_RDI + 0x110);
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::conservativeResize
            ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)in_stack_fffffffffffffd00,
             (Index)in_stack_fffffffffffffcf8);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::setZero
            ((DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)in_stack_fffffffffffffd00);
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::conservativeResize
            ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)in_stack_fffffffffffffd00,
             (Index)in_stack_fffffffffffffcf8);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::setZero
            ((DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)in_stack_fffffffffffffd00);
  local_170.super_Matrix<double,_6,_6,_0,_6,_6>.
  super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[0x22] =
       (double)Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::transpose
                         ((DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)
                          in_stack_fffffffffffffcf8);
  Eigen::HouseholderQR<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
  HouseholderQR<Eigen::Transpose<Eigen::Matrix<double,_1,_1,0,_1,_1>>>(this_02,matrix);
  Eigen::HouseholderQR<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator=
            (in_stack_fffffffffffffd00,in_stack_fffffffffffffcf8);
  Eigen::HouseholderQR<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::~HouseholderQR
            (in_stack_fffffffffffffd00);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::Zero
            (in_stack_fffffffffffffd08,(Index)in_stack_fffffffffffffd00);
  Eigen::Matrix<double,-1,-1,0,-1,-1>::operator=
            (&in_stack_fffffffffffffd00->m_qr,
             (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
              *)in_stack_fffffffffffffcf8);
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::rows
            ((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)0x14bb57);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::Zero
            (in_stack_fffffffffffffd08,(Index)in_stack_fffffffffffffd00);
  Eigen::Matrix<double,-1,-1,0,-1,-1>::operator=
            (&in_stack_fffffffffffffd00->m_qr,
             (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
              *)in_stack_fffffffffffffcf8);
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::rows
            ((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)0x14bbb3);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::Zero
            (in_stack_fffffffffffffd08,(Index)in_stack_fffffffffffffd00);
  Eigen::Matrix<double,-1,-1,0,-1,-1>::operator=
            (&in_stack_fffffffffffffd00->m_qr,
             (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
              *)in_stack_fffffffffffffcf8);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::Zero(in_stack_fffffffffffffd08);
  Eigen::Matrix<double,-1,1,0,-1,1>::operator=
            ((Matrix<double,__1,_1,_0,__1,_1> *)in_stack_fffffffffffffd00,
             (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
              *)in_stack_fffffffffffffcf8);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::Zero(in_stack_fffffffffffffd08);
  Eigen::Matrix<double,-1,1,0,-1,1>::operator=
            ((Matrix<double,__1,_1,_0,__1,_1> *)in_stack_fffffffffffffd00,
             (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
              *)in_stack_fffffffffffffcf8);
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::conservativeResize
            ((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)in_stack_fffffffffffffd00
             ,(Index)in_stack_fffffffffffffcf8,0x14bc96);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::setZero
            ((DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)in_stack_fffffffffffffd00);
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::conservativeResize
            ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)in_stack_fffffffffffffd00,
             (Index)in_stack_fffffffffffffcf8);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::setZero
            ((DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)in_stack_fffffffffffffd00);
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::conservativeResize
            ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)in_stack_fffffffffffffd00,
             (Index)in_stack_fffffffffffffcf8);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::setZero
            ((DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)in_stack_fffffffffffffd00);
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::conservativeResize
            ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)in_stack_fffffffffffffd00,
             (Index)in_stack_fffffffffffffcf8);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::setZero
            ((DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)in_stack_fffffffffffffd00);
  std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::resize
            ((vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_> *)
             in_stack_fffffffffffffd30,in_stack_fffffffffffffd28,in_stack_fffffffffffffd20);
  std::vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>::size
            ((vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_> *)
             (local_10 + 0x308));
  std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::resize
            ((vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_> *)
             in_stack_fffffffffffffd30,in_stack_fffffffffffffd28,in_stack_fffffffffffffd20);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::Zero();
  Vector3_t::
  Vector3_t<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>>>
            ((Vector3_t *)in_stack_fffffffffffffd00,
             (MatrixBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
              *)in_stack_fffffffffffffcf8);
  std::vector<Vector3_t,_std::allocator<Vector3_t>_>::resize
            ((vector<Vector3_t,_std::allocator<Vector3_t>_> *)in_stack_fffffffffffffd30,
             in_stack_fffffffffffffd28,(value_type *)in_stack_fffffffffffffd20);
  std::vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>::size
            ((vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_> *)
             (local_10 + 0x308));
  std::vector<SpatialVector_t,_std::allocator<SpatialVector_t>_>::vector
            ((vector<SpatialVector_t,_std::allocator<SpatialVector_t>_> *)this_01,
             in_stack_fffffffffffffd38,in_stack_fffffffffffffd30);
  std::vector<SpatialVector_t,_std::allocator<SpatialVector_t>_>::operator=
            ((vector<SpatialVector_t,_std::allocator<SpatialVector_t>_> *)in_stack_fffffffffffffd00,
             (vector<SpatialVector_t,_std::allocator<SpatialVector_t>_> *)in_stack_fffffffffffffcf8)
  ;
  std::vector<SpatialVector_t,_std::allocator<SpatialVector_t>_>::~vector
            ((vector<SpatialVector_t,_std::allocator<SpatialVector_t>_> *)0x14be82);
  std::vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>::size
            ((vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_> *)
             (local_10 + 0x308));
  num = (double *)
        ((long)local_170.super_Matrix<double,_6,_6,_0,_6,_6>.
               super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array +
        0x30);
  std::vector<SpatialVector_t,_std::allocator<SpatialVector_t>_>::vector
            ((vector<SpatialVector_t,_std::allocator<SpatialVector_t>_> *)this_01,(size_type)num,
             in_stack_fffffffffffffd30);
  std::vector<SpatialVector_t,_std::allocator<SpatialVector_t>_>::operator=
            ((vector<SpatialVector_t,_std::allocator<SpatialVector_t>_> *)in_stack_fffffffffffffd00,
             (vector<SpatialVector_t,_std::allocator<SpatialVector_t>_> *)in_stack_fffffffffffffcf8)
  ;
  std::vector<SpatialVector_t,_std::allocator<SpatialVector_t>_>::~vector
            ((vector<SpatialVector_t,_std::allocator<SpatialVector_t>_> *)0x14beda);
  std::vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>::size
            ((vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_> *)
             (local_10 + 0x308));
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::Zero(in_stack_fffffffffffffd08);
  Eigen::Matrix<double,-1,1,0,-1,1>::operator=
            ((Matrix<double,__1,_1,_0,__1,_1> *)in_stack_fffffffffffffd00,
             (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
              *)in_stack_fffffffffffffcf8);
  std::vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>::size
            ((vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_> *)
             (local_10 + 0x308));
  val = &local_170;
  std::vector<SpatialMatrix_t,_std::allocator<SpatialMatrix_t>_>::vector(this_01,(size_type)num,val)
  ;
  std::vector<SpatialMatrix_t,_std::allocator<SpatialMatrix_t>_>::operator=
            ((vector<SpatialMatrix_t,_std::allocator<SpatialMatrix_t>_> *)in_stack_fffffffffffffd00,
             (vector<SpatialMatrix_t,_std::allocator<SpatialMatrix_t>_> *)in_stack_fffffffffffffcf8)
  ;
  std::vector<SpatialMatrix_t,_std::allocator<SpatialMatrix_t>_>::~vector
            ((vector<SpatialMatrix_t,_std::allocator<SpatialMatrix_t>_> *)0x14bf74);
  std::vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>::size
            ((vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_> *)
             (local_10 + 0x308));
  this_04 = &local_188;
  std::vector<SpatialVector_t,_std::allocator<SpatialVector_t>_>::vector
            ((vector<SpatialVector_t,_std::allocator<SpatialVector_t>_> *)this_01,(size_type)num,
             (value_type *)val);
  std::vector<SpatialVector_t,_std::allocator<SpatialVector_t>_>::operator=
            ((vector<SpatialVector_t,_std::allocator<SpatialVector_t>_> *)in_stack_fffffffffffffd00,
             (vector<SpatialVector_t,_std::allocator<SpatialVector_t>_> *)in_stack_fffffffffffffcf8)
  ;
  std::vector<SpatialVector_t,_std::allocator<SpatialVector_t>_>::~vector
            ((vector<SpatialVector_t,_std::allocator<SpatialVector_t>_> *)0x14bfcc);
  std::vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>::size
            ((vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_> *)
             (local_10 + 0x308));
  other = local_1a0;
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::Zero(in_stack_fffffffffffffd08);
  Eigen::Matrix<double,-1,1,0,-1,1>::operator=
            ((Matrix<double,__1,_1,_0,__1,_1> *)in_stack_fffffffffffffd00,other);
  __a = (allocator_type *)
        std::vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>::
        size((vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_> *)
             (local_10 + 0x308));
  this_03 = (Vector3_t *)local_1e0;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::Zero();
  __value = (value_type *)(local_1e0 + 0x10);
  Vector3_t::
  Vector3_t<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>>>
            (this_03,(MatrixBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                      *)other);
  __n = &local_1e1;
  std::allocator<Vector3_t>::allocator((allocator<Vector3_t> *)0x14c060);
  std::vector<Vector3_t,_std::allocator<Vector3_t>_>::vector(this_04,(size_type)__n,__value,__a);
  std::vector<Vector3_t,_std::allocator<Vector3_t>_>::operator=
            ((vector<Vector3_t,_std::allocator<Vector3_t>_> *)__value,
             (vector<Vector3_t,_std::allocator<Vector3_t>_> *)__a);
  std::vector<Vector3_t,_std::allocator<Vector3_t>_>::~vector
            ((vector<Vector3_t,_std::allocator<Vector3_t>_> *)__value);
  std::allocator<Vector3_t>::~allocator((allocator<Vector3_t> *)0x14c0b4);
  *(undefined1 *)(in_RDI + 4) = 1;
  return (bool)(*(byte *)(in_RDI + 4) & 1);
}

Assistant:

bool ConstraintSet::Bind (const Model &model) {
	assert (bound == false);

	if (bound) {
		std::cerr << "Error: binding an already bound constraint set!" << std::endl;
		abort();
	}
	unsigned int n_constr = size();

	H.conservativeResize (model.dof_count, model.dof_count);
	H.setZero();
	C.conservativeResize (model.dof_count);
	C.setZero();
	gamma.conservativeResize (n_constr);
	gamma.setZero();
	G.conservativeResize (n_constr, model.dof_count);
	G.setZero();
	A.conservativeResize (model.dof_count + n_constr, model.dof_count + n_constr);
	A.setZero();
	b.conservativeResize (model.dof_count + n_constr);
	b.setZero();
	x.conservativeResize (model.dof_count + n_constr);
	x.setZero();

#ifdef RBDL_USE_SIMPLE_MATH
	GT_qr = SimpleMath::HouseholderQR<Math::MatrixNd> (G.transpose());
#else
	GT_qr = Eigen::HouseholderQR<Math::MatrixNd> (G.transpose());
#endif
	GT_qr_Q = MatrixNd::Zero (model.dof_count, model.dof_count);
	Y = MatrixNd::Zero (model.dof_count, G.rows());
	Z = MatrixNd::Zero (model.dof_count, model.dof_count - G.rows());
	qddot_y = VectorNd::Zero (model.dof_count);
	qddot_z = VectorNd::Zero (model.dof_count);

	K.conservativeResize (n_constr, n_constr);
	K.setZero();
	a.conservativeResize (n_constr);
	a.setZero();
	QDDot_t.conservativeResize (model.dof_count);
	QDDot_t.setZero();
	QDDot_0.conservativeResize (model.dof_count);
	QDDot_0.setZero();
	f_t.resize (n_constr, SpatialVectorZero);
	f_ext_constraints.resize (model.mBodies.size(), SpatialVectorZero);
	point_accel_0.resize (n_constr, Vector3d::Zero());

	d_pA = std::vector<SpatialVector> (model.mBodies.size(), SpatialVectorZero);
	d_a = std::vector<SpatialVector> (model.mBodies.size(), SpatialVectorZero);
	d_u = VectorNd::Zero (model.mBodies.size());

	d_IA = std::vector<SpatialMatrix> (model.mBodies.size(), SpatialMatrixIdentity);
	d_U = std::vector<SpatialVector> (model.mBodies.size(), SpatialVectorZero);
	d_d = VectorNd::Zero (model.mBodies.size());

	d_multdof3_u = std::vector<Math::Vector3d> (model.mBodies.size(), Math::Vector3d::Zero());

	bound = true;

	return bound;
}